

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O0

void Fxch_ManFree(Fxch_Man_t *pFxchMan)

{
  Fxch_Man_t *pFxchMan_local;
  
  Vec_WecFree(pFxchMan->vLits);
  Vec_IntFree(pFxchMan->vLitCount);
  Vec_IntFree(pFxchMan->vLitHashKeys);
  Hsh_VecManStop(pFxchMan->pDivHash);
  Vec_FltFree(pFxchMan->vDivWeights);
  Vec_QueFree(pFxchMan->vDivPrio);
  Vec_WecFree(pFxchMan->vDivCubePairs);
  Vec_IntFree(pFxchMan->vLevels);
  Vec_IntFree(pFxchMan->vCubeFree);
  Vec_IntFree(pFxchMan->vDiv);
  Vec_IntFree(pFxchMan->vCubesS);
  Vec_IntFree(pFxchMan->vPairs);
  Vec_IntFree(pFxchMan->vCubesToUpdate);
  Vec_IntFree(pFxchMan->vCubesToRemove);
  Vec_IntFree(pFxchMan->vSCC);
  if (pFxchMan != (Fxch_Man_t *)0x0) {
    free(pFxchMan);
  }
  return;
}

Assistant:

void Fxch_ManFree( Fxch_Man_t* pFxchMan )
{
    Vec_WecFree( pFxchMan->vLits );
    Vec_IntFree( pFxchMan->vLitCount );
    Vec_IntFree( pFxchMan->vLitHashKeys );
    Hsh_VecManStop( pFxchMan->pDivHash );
    Vec_FltFree( pFxchMan->vDivWeights );
    Vec_QueFree( pFxchMan->vDivPrio );
    Vec_WecFree( pFxchMan->vDivCubePairs );
    Vec_IntFree( pFxchMan->vLevels );

    Vec_IntFree( pFxchMan->vCubeFree );
    Vec_IntFree( pFxchMan->vDiv );

    Vec_IntFree( pFxchMan->vCubesS );
    Vec_IntFree( pFxchMan->vPairs );
    Vec_IntFree( pFxchMan->vCubesToUpdate );
    Vec_IntFree( pFxchMan->vCubesToRemove );
    Vec_IntFree( pFxchMan->vSCC );

    ABC_FREE( pFxchMan );
}